

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

void __thiscall GameEngine::finishStep(GameEngine *this)

{
  bool end;
  
  end = calculate(this);
  notify(this,end);
  if (end) {
    return;
  }
  this->currentStep = this->currentStep + 1;
  this->currentPlayer =
       (int32_t)(((long)this->currentPlayer + 1U) %
                (ulong)((long)(this->players).
                              super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->players).
                              super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4));
  nextStep(this);
  return;
}

Assistant:

void GameEngine::finishStep() {
  bool end = calculate();
  notify(end);

  if (!end) {
    ++currentStep;
    ++currentPlayer;
    currentPlayer %= players.size();
    nextStep();
  }
}